

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_error(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  int level;
  int in_stack_0000005c;
  lua_State *in_stack_00000060;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int idx;
  
  lVar3 = luaL_optinteger(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                          CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  iVar2 = (int)lVar3;
  lua_settop(in_RDI,1);
  idx = (int)((ulong)in_RDI >> 0x20);
  iVar1 = lua_isstring((lua_State *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                       in_stack_ffffffffffffffec);
  if ((iVar1 != 0) && (0 < iVar2)) {
    luaL_where(in_stack_00000060,in_stack_0000005c);
    lua_pushvalue(unaff_retaddr,idx);
    lua_concat((lua_State *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  iVar2 = lua_error((lua_State *)0x110051);
  return iVar2;
}

Assistant:

static int luaB_error(lua_State*L){
int level=luaL_optint(L,2,1);
lua_settop(L,1);
if(lua_isstring(L,1)&&level>0){
luaL_where(L,level);
lua_pushvalue(L,1);
lua_concat(L,2);
}
return lua_error(L);
}